

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_2>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *kernel_local;
  
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_2>
  ::run(kernel);
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_2,_3>
  ::run(kernel);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::DstEvaluatorType::XprType DstXprType;
    typedef typename Kernel::PacketType PacketType;

    enum { size = DstXprType::SizeAtCompileTime,
           packetSize =unpacket_traits<PacketType>::size,
           alignedSize = (int(size)/packetSize)*packetSize };

    copy_using_evaluator_innervec_CompleteUnrolling<Kernel, 0, alignedSize>::run(kernel);
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Kernel, alignedSize, size>::run(kernel);
  }